

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O1

void rtcReleaseDevice(RTCDevice hdevice)

{
  undefined8 *puVar1;
  Lock<embree::MutexSys> lock;
  MutexSys *local_48;
  char local_40;
  undefined7 uStack_3f;
  undefined1 local_38 [16];
  
  if (hdevice != (RTCDevice)0x0) {
    local_48 = &g_mutex;
    local_40 = '\x01';
    embree::MutexSys::lock(&g_mutex);
    (**(code **)(*(long *)hdevice + 0x18))(hdevice);
    if (local_40 == '\x01') {
      embree::MutexSys::unlock(local_48);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  local_48 = (MutexSys *)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"invalid argument","");
  *puVar1 = &PTR__rtcore_error_022018b0;
  *(undefined4 *)(puVar1 + 1) = 2;
  puVar1[2] = puVar1 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar1 + 2),local_48,
             (undefined1 *)((long)local_48 + CONCAT71(uStack_3f,local_40)));
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcReleaseDevice(RTCDevice hdevice) 
  {
    Device* device = (Device*) hdevice;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcReleaseDevice);
    RTC_VERIFY_HANDLE(hdevice);
    Lock<MutexSys> lock(g_mutex);
    device->refDec();
    RTC_CATCH_END(nullptr);
  }